

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::CheckTableType(VM *this,Value *t,Value *k,char *op,char *desc)

{
  Table *pTVar1;
  undefined8 uVar2;
  char *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op_desc;
  char *key_name;
  pair<const_char_*,_int> pos;
  pair<const_char_*,_const_char_*> ns;
  char *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  VM *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  Value *in_stack_fffffffffffffef8;
  string local_100 [4];
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  RuntimeException *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff20;
  string local_c0 [32];
  string local_a0 [56];
  Value *in_stack_ffffffffffffff98;
  VM *in_stack_ffffffffffffffa0;
  
  if ((*(int *)(in_RSI + 1) != 7) &&
     ((*(int *)(in_RSI + 1) != 8 ||
      (pTVar1 = UserData::GetMetatable((UserData *)*in_RSI), pTVar1 == (Table *)0x0)))) {
    GetOperandNameAndScope(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    GetCurrentInstructionPos(in_stack_fffffffffffffec0);
    if (*(int *)(in_RDX + 1) == 4) {
      String::GetCStr((String *)*in_RDX);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,in_RCX,(allocator *)&stack0xfffffffffffffeff);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
    uVar2 = __cxa_allocate_exception(0x20);
    std::__cxx11::string::c_str();
    RuntimeException::RuntimeException
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_ffffffffffffff20);
    __cxa_throw(uVar2,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  return;
}

Assistant:

void VM::CheckTableType(const Value *t, const Value *k,
                            const char *op, const char *desc) const
    {
        if (t->type_ == ValueT_Table ||
            (t->type_ == ValueT_UserData && t->user_data_->GetMetatable()))
            return ;

        auto ns = GetOperandNameAndScope(t);
        auto pos = GetCurrentInstructionPos();
        auto key_name = k->type_ == ValueT_String ? k->str_->GetCStr() : "?";
        auto op_desc = std::string(op) + " table key '" + key_name + "' " + desc;

        throw RuntimeException(pos.first, pos.second, t,
                ns.first, ns.second, op_desc.c_str());
    }